

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall deqp::gles2::Functional::Tex2DShader::Tex2DShader(Tex2DShader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ShaderProgramDeclaration *pSVar3;
  long *local_2a8;
  long local_2a0;
  long local_298 [2];
  long *local_288;
  long local_280;
  long local_278 [2];
  long *local_268;
  long local_260;
  long local_258 [2];
  VertexSource local_248;
  long *local_228;
  long local_220;
  long local_218 [2];
  long *local_208;
  long local_200;
  long local_1f8 [2];
  FragmentOutput local_1e4;
  VertexAttribute local_1e0;
  VertexAttribute local_1b8;
  FragmentSource local_190;
  Uniform local_170;
  VertexToFragmentVarying local_148;
  ShaderProgramDeclaration local_140;
  
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  local_268 = local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"a_position","");
  local_1b8.name._M_dataplus._M_p = (pointer)&local_1b8.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,local_268,local_260 + (long)local_268);
  local_1b8.type = GENERICVECTYPE_FLOAT;
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,&local_1b8);
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"a_coord","");
  local_1e0.name._M_dataplus._M_p = (pointer)&local_1e0.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,local_288,local_280 + (long)local_288);
  local_1e0.type = GENERICVECTYPE_FLOAT;
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_1e0);
  local_148.type = GENERICVECTYPE_FLOAT;
  local_148.flatshade = false;
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_148);
  local_1e4.type = GENERICVECTYPE_FLOAT;
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_1e4);
  local_208 = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"u_sampler0","");
  paVar1 = &local_170.name.field_2;
  local_170.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,local_208,local_200 + (long)local_208);
  local_170.type = TYPE_SAMPLER_2D;
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_170);
  local_2a8 = local_298;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a8,
             "attribute highp vec4 a_position;\nattribute mediump vec2 a_coord;\nvarying mediump vec2 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,"");
  local_248.source._M_dataplus._M_p = (pointer)&local_248.source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,local_2a8,local_2a0 + (long)local_2a8);
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_248);
  local_228 = local_218;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_228,
             "uniform sampler2D u_sampler0;\nvarying mediump vec2 v_coord;\nvoid main (void)\n{\n\tgl_FragColor = texture2D(u_sampler0, v_coord);\n}\n"
             ,"");
  paVar2 = &local_190.source.field_2;
  local_190.source._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,local_228,local_220 + (long)local_228);
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_190);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.source._M_dataplus._M_p != paVar2) {
    operator_delete(local_190.source._M_dataplus._M_p,
                    local_190.source.field_2._M_allocated_capacity + 1);
  }
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.source._M_dataplus._M_p != &local_248.source.field_2) {
    operator_delete(local_248.source._M_dataplus._M_p,
                    local_248.source.field_2._M_allocated_capacity + 1);
  }
  if (local_2a8 != local_298) {
    operator_delete(local_2a8,local_298[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_170.name._M_dataplus._M_p,local_170.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.name._M_dataplus._M_p != &local_1e0.name.field_2) {
    operator_delete(local_1e0.name._M_dataplus._M_p,local_1e0.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.name._M_dataplus._M_p != &local_1b8.name.field_2) {
    operator_delete(local_1b8.name._M_dataplus._M_p,local_1b8.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_268 != local_258) {
    operator_delete(local_268,local_258[0] + 1);
  }
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_007755b8;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_007755f0;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_00775608;
  return;
}

Assistant:

Tex2DShader (void)
		: ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
					<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexAttribute("a_coord", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::Uniform("u_sampler0", glu::TYPE_SAMPLER_2D)
					<< sglr::pdec::VertexSource("attribute highp vec4 a_position;\n"
												"attribute mediump vec2 a_coord;\n"
												"varying mediump vec2 v_coord;\n"
												"void main (void)\n"
												"{\n"
												"	gl_Position = a_position;\n"
												"	v_coord = a_coord;\n"
												"}\n")
					<< sglr::pdec::FragmentSource("uniform sampler2D u_sampler0;\n"
												  "varying mediump vec2 v_coord;\n"
												  "void main (void)\n"
												  "{\n"
												  "	gl_FragColor = texture2D(u_sampler0, v_coord);\n"
												  "}\n"))
	{
	}